

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::TruncateLogFile(char *path,int64 limit,int64 keep)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ssize_t sVar4;
  int *piVar5;
  uint uVar6;
  SendMethod in_R9;
  uint uVar7;
  long __offset;
  char *pcVar8;
  LogMessage local_20f8;
  code *local_20e8;
  undefined8 uStack_20e0;
  long local_20d8;
  char *local_20d0;
  stat statbuf;
  char copybuf [8192];
  
  iVar1 = strncmp("/proc/self/fd/",path,0xe);
  iVar1 = open(path,(uint)(iVar1 != 0) << 0x11 | 2);
  if (iVar1 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 == 0x1b) {
      iVar1 = truncate(path,0);
      if (iVar1 != -1) {
        LogMessage::LogMessage
                  (&local_20f8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x7c5,2);
        poVar3 = std::operator<<(&((local_20f8.data_)->stream_).super_ostream,"Truncated ");
        poVar3 = std::operator<<(poVar3,path);
        std::operator<<(poVar3," due to EFBIG error");
        LogMessage::~LogMessage(&local_20f8);
        return;
      }
      local_20e8 = LogMessage::SendToLog;
      uStack_20e0 = 0;
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_20f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7c3,2,0,in_R9);
      poVar3 = std::operator<<(&((local_20f8.data_)->stream_).super_ostream,"Unable to truncate ");
      std::operator<<(poVar3,path);
    }
    else {
      local_20e8 = LogMessage::SendToLog;
      uStack_20e0 = 0;
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_20f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7c8,2,0,in_R9);
      poVar3 = std::operator<<(&((local_20f8.data_)->stream_).super_ostream,"Unable to open ");
      std::operator<<(poVar3,path);
    }
    ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_20f8);
    return;
  }
  iVar2 = fstat(iVar1,(stat *)&statbuf);
  if (iVar2 == -1) {
    local_20e8 = LogMessage::SendToLog;
    uStack_20e0 = 0;
    ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_20f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x7ce,2,0,in_R9);
    std::operator<<(&((local_20f8.data_)->stream_).super_ostream,"Unable to fstat()");
  }
  else {
    if (((statbuf.st_mode & 0xf000) != 0x8000) ||
       (__offset = statbuf.st_size - keep,
       (__offset == 0 || statbuf.st_size < keep) || statbuf.st_size <= limit)) goto LAB_0011486c;
    LogMessage::LogMessage
              (&local_20f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x7d9);
    poVar3 = std::operator<<(&((local_20f8.data_)->stream_).super_ostream,"Truncating ");
    poVar3 = std::operator<<(poVar3,path);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3," bytes");
    local_20d0 = path;
    LogMessage::~LogMessage(&local_20f8);
    local_20d8 = 0;
    while( true ) {
      sVar4 = pread(iVar1,copybuf,0x2000,__offset);
      pcVar8 = local_20d0;
      uVar7 = (uint)sVar4;
      if ((int)uVar7 < 1) break;
      sVar4 = pwrite(iVar1,copybuf,(ulong)(uVar7 & 0x7fffffff),local_20d8);
      uVar6 = (uint)sVar4;
      if (uVar6 == 0xffffffff) {
        local_20e8 = LogMessage::SendToLog;
        uStack_20e0 = 0;
        ErrnoLogMessage::ErrnoLogMessage
                  ((ErrnoLogMessage *)&local_20f8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x7e2,2,0,in_R9);
        poVar3 = std::operator<<(&((local_20f8.data_)->stream_).super_ostream,"Unable to write to ")
        ;
        pcVar8 = local_20d0;
        std::operator<<(poVar3,local_20d0);
        ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_20f8);
        goto LAB_00114a2b;
      }
      if (uVar6 != uVar7) {
        LogMessage::LogMessage
                  (&local_20f8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x7e5,2);
        poVar3 = std::operator<<(&((local_20f8.data_)->stream_).super_ostream,"Expected to write ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar7);
        poVar3 = std::operator<<(poVar3,", wrote ");
        std::ostream::operator<<(poVar3,uVar6);
        LogMessage::~LogMessage(&local_20f8);
      }
      __offset = __offset + (ulong)(uVar7 & 0x7fffffff);
      local_20d8 = local_20d8 + (int)uVar6;
    }
    if (uVar7 == 0xffffffff) {
      local_20e8 = LogMessage::SendToLog;
      uStack_20e0 = 0;
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_20f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7ea,2,0,in_R9);
      poVar3 = std::operator<<(&((local_20f8.data_)->stream_).super_ostream,"Unable to read from ");
      std::operator<<(poVar3,pcVar8);
      ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_20f8);
    }
LAB_00114a2b:
    iVar2 = ftruncate(iVar1,local_20d8);
    if (iVar2 != -1) goto LAB_0011486c;
    local_20e8 = LogMessage::SendToLog;
    uStack_20e0 = 0;
    ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_20f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x7f0,2,0,in_R9);
    poVar3 = std::operator<<(&((local_20f8.data_)->stream_).super_ostream,"Unable to truncate ");
    std::operator<<(poVar3,pcVar8);
  }
  ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_20f8);
LAB_0011486c:
  close(iVar1);
  return;
}

Assistant:

void TruncateLogFile(const char *path, int64 limit, int64 keep) {
#ifdef HAVE_UNISTD_H
  struct stat statbuf;
  const int kCopyBlockSize = 8 << 10;
  char copybuf[kCopyBlockSize];
  int64 read_offset, write_offset;
  // Don't follow symlinks unless they're our own fd symlinks in /proc
  int flags = O_RDWR;
  // TODO(hamaji): Support other environments.
#ifdef OS_LINUX
  const char *procfd_prefix = "/proc/self/fd/";
  if (strncmp(procfd_prefix, path, strlen(procfd_prefix))) flags |= O_NOFOLLOW;
#endif

  int fd = open(path, flags);
  if (fd == -1) {
    if (errno == EFBIG) {
      // The log file in question has got too big for us to open. The
      // real fix for this would be to compile logging.cc (or probably
      // all of base/...) with -D_FILE_OFFSET_BITS=64 but that's
      // rather scary.
      // Instead just truncate the file to something we can manage
      if (truncate(path, 0) == -1) {
        PLOG(ERROR) << "Unable to truncate " << path;
      } else {
        LOG(ERROR) << "Truncated " << path << " due to EFBIG error";
      }
    } else {
      PLOG(ERROR) << "Unable to open " << path;
    }
    return;
  }

  if (fstat(fd, &statbuf) == -1) {
    PLOG(ERROR) << "Unable to fstat()";
    goto out_close_fd;
  }

  // See if the path refers to a regular file bigger than the
  // specified limit
  if (!S_ISREG(statbuf.st_mode)) goto out_close_fd;
  if (statbuf.st_size <= limit)  goto out_close_fd;
  if (statbuf.st_size <= keep) goto out_close_fd;

  // This log file is too large - we need to truncate it
  LOG(INFO) << "Truncating " << path << " to " << keep << " bytes";

  // Copy the last "keep" bytes of the file to the beginning of the file
  read_offset = statbuf.st_size - keep;
  write_offset = 0;
  int bytesin, bytesout;
  while ((bytesin = pread(fd, copybuf, sizeof(copybuf), read_offset)) > 0) {
    bytesout = pwrite(fd, copybuf, bytesin, write_offset);
    if (bytesout == -1) {
      PLOG(ERROR) << "Unable to write to " << path;
      break;
    } else if (bytesout != bytesin) {
      LOG(ERROR) << "Expected to write " << bytesin << ", wrote " << bytesout;
    }
    read_offset += bytesin;
    write_offset += bytesout;
  }
  if (bytesin == -1) PLOG(ERROR) << "Unable to read from " << path;

  // Truncate the remainder of the file. If someone else writes to the
  // end of the file after our last read() above, we lose their latest
  // data. Too bad ...
  if (ftruncate(fd, write_offset) == -1) {
    PLOG(ERROR) << "Unable to truncate " << path;
  }

 out_close_fd:
  close(fd);
#else
  LOG(ERROR) << "No log truncation support.";
#endif
}